

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_RK4.cpp
# Opt level: O2

double * __thiscall PP_RK4::RK4step(PP_RK4 *this,double x,double y,double z,double t,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  
  pdVar5 = RK4K1(this,x,y,z,t,dt);
  pdVar6 = RK4K2(this,x,y,z,*pdVar5,pdVar5[1],pdVar5[2],t,dt);
  pdVar7 = RK4K3(this,x,y,z,*pdVar6,pdVar6[1],pdVar6[2],t,dt);
  pdVar8 = RK4K4(this,x,y,z,*pdVar7,pdVar7[1],pdVar7[2],t,dt);
  pdVar9 = (double *)operator_new__(0x18);
  dVar1 = pdVar5[1];
  dVar2 = pdVar6[1];
  dVar3 = pdVar7[1];
  dVar4 = pdVar8[1];
  *pdVar9 = (*pdVar8 + *pdVar7 + *pdVar7 + *pdVar6 + *pdVar6 + *pdVar5) * 0.16666666666666666;
  pdVar9[1] = (dVar4 + dVar3 + dVar3 + dVar2 + dVar2 + dVar1) * 0.16666666666666666;
  pdVar9[2] = (pdVar7[2] + pdVar7[2] + pdVar6[2] + pdVar6[2] + pdVar5[2] + pdVar8[2]) *
              0.16666666666666666;
  operator_delete(pdVar5,8);
  operator_delete(pdVar6,8);
  operator_delete(pdVar7,8);
  operator_delete(pdVar8,8);
  return pdVar9;
}

Assistant:

double* PP_RK4::RK4step(double x, double y, double z, double t, double dt)
{
    double* K1 = RK4K1(x, y, z, t, dt);
    double* K2 = RK4K2(x, y, z, K1[0], K1[1], K1[2], t, dt);
    double* K3 = RK4K3(x, y, z, K2[0], K2[1], K2[2], t, dt);
    double* K4 = RK4K4(x, y, z, K3[0], K3[1], K3[2], t, dt);
    double* dr = new double[3];
    dr[0] = (1.0/6.0)*(K1[0] + 2.0*K2[0] + 2*K3[0] + K4[0]);
    dr[1] = (1.0/6.0)*(K1[1] + 2.0*K2[1] + 2*K3[1] + K4[1]);
    dr[2] = (1.0/6.0)*(K1[2] + 2.0*K2[2] + 2*K3[2] + K4[2]);
    delete K1;
    delete K2;
    delete K3;
    delete K4;
    return dr;
}